

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O2

void __thiscall cppcms::plugin::scope::scope(scope *this,int argc,char **argv)

{
  _data *this_00;
  value v;
  
  this_00 = (_data *)operator_new(0x68);
  (this_00->paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->pattern)._M_dataplus._M_p = (pointer)0x0;
  (this_00->pattern)._M_string_length = 0;
  (this_00->pattern).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->pattern).field_2 + 8) = 0;
  *(undefined8 *)&(this_00->objects)._M_t._M_impl = 0;
  *(undefined8 *)&(this_00->objects)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this_00->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this_00->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this_00->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  _data::_data(this_00);
  (this->d).ptr_ = this_00;
  service::load_settings((service *)&v,argc,argv);
  init(this,(EVP_PKEY_CTX *)&v);
  json::value::copyable::~copyable(&v.d);
  return;
}

Assistant:

scope::scope(int argc,char **argv) : d(new scope::_data())
{
	json::value v = service::load_settings(argc,argv);
	init(v);
}